

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# write_number.hpp
# Opt level: O0

type_conflict2
jsoncons::detail::from_integer<__int128,std::__cxx11::string>
          (__int128 value,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *result)

{
  char cVar1;
  assertion_error *this;
  undefined8 in_RDX;
  char *pcVar2;
  long in_RSI;
  undefined8 in_RDI;
  undefined1 auVar3 [16];
  size_t count;
  bool is_negative;
  char_type *last;
  char_type *p;
  char_type buf [255];
  string *in_stack_fffffffffffffe48;
  bool local_199;
  bool local_191;
  type_conflict2 local_190;
  allocator<char> *in_stack_fffffffffffffe80;
  char *in_stack_fffffffffffffe88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe90;
  char *local_140;
  char local_138 [255];
  char local_39 [9];
  undefined8 local_30;
  undefined1 local_28 [16];
  
  auVar3._8_8_ = in_RSI;
  auVar3._0_8_ = in_RDI;
  local_140 = local_138;
  local_30 = in_RDX;
  if (in_RSI < 0) {
    do {
      local_28._8_8_ = auVar3._8_8_;
      local_28._0_8_ = auVar3._0_8_;
      cVar1 = __modti3(local_28._0_8_,local_28._8_8_,10,0);
      local_28 = auVar3;
      pcVar2 = local_140 + 1;
      *local_140 = '0' - cVar1;
      auVar3 = __divti3(local_28._0_8_,local_28._8_8_,10,0);
      local_191 = (auVar3._0_8_ != 0 || auVar3._8_8_ != 0) && pcVar2 < local_39;
      local_140 = pcVar2;
    } while (local_191);
  }
  else {
    do {
      local_28._8_8_ = auVar3._8_8_;
      local_28._0_8_ = auVar3._0_8_;
      cVar1 = __modti3(local_28._0_8_,local_28._8_8_,10,0);
      local_28 = auVar3;
      pcVar2 = local_140 + 1;
      *local_140 = cVar1 + '0';
      auVar3 = __divti3(local_28._0_8_,local_28._8_8_,10,0);
      local_199 = (auVar3._0_8_ != 0 || auVar3._8_8_ != 0) && pcVar2 < local_39;
      local_140 = pcVar2;
    } while (local_199);
  }
  local_28 = auVar3;
  if (local_140 == local_39) {
    this = (assertion_error *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,in_stack_fffffffffffffe80);
    assertion_error::assertion_error(this,in_stack_fffffffffffffe48);
    __cxa_throw(this,&assertion_error::typeinfo,assertion_error::~assertion_error);
  }
  local_190 = (long)local_140 - (long)local_138;
  if (in_RSI < 0) {
    std::__cxx11::string::push_back((char)local_30);
    local_190 = local_190 + 1;
  }
  while (local_140 = local_140 + -1, local_138 <= local_140) {
    std::__cxx11::string::push_back((char)local_30);
  }
  return local_190;
}

Assistant:

typename std::enable_if<ext_traits::is_integer<Integer>::value,std::size_t>::type
    from_integer(Integer value, Result& result)
    {
        using char_type = typename Result::value_type;

        char_type buf[255];
        char_type *p = buf;
        const char_type* last = buf+255;

        bool is_negative = value < 0;

        if (value < 0)
        {
            do
            {
                *p++ = static_cast<char_type>(48 - (value % 10));
            }
            while ((value /= 10) && (p < last));
        }
        else
        {

            do
            {
                *p++ = static_cast<char_type>(48 + value % 10);
            }
            while ((value /= 10) && (p < last));
        }
        JSONCONS_ASSERT(p != last);

        std::size_t count = (p - buf);
        if (is_negative)
        {
            result.push_back('-');
            ++count;
        }
        while (--p >= buf)
        {
            result.push_back(*p);
        }

        return count;
    }